

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O3

Fad<float> * __thiscall
Fad<float>::operator+=(Fad<float> *this,FadExpr<FadBinaryDiv<Fad<float>,_Fad<float>_>_> *x)

{
  float fVar1;
  float fVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  Fad<float> *pFVar8;
  Fad<float> *pFVar9;
  float *pfVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  float *pfVar14;
  long lVar15;
  float *pfVar16;
  float *pfVar17;
  float *pfVar18;
  
  pFVar8 = (x->fadexpr_).left_;
  pFVar9 = (x->fadexpr_).right_;
  uVar3 = (pFVar8->dx_).num_elts;
  uVar4 = (pFVar9->dx_).num_elts;
  uVar11 = uVar4;
  if ((int)uVar4 < (int)uVar3) {
    uVar11 = uVar3;
  }
  if (uVar11 != 0) {
    uVar5 = (this->dx_).num_elts;
    uVar12 = (ulong)uVar5;
    if (uVar12 == 0) {
      (this->dx_).num_elts = uVar11;
      uVar13 = (ulong)uVar11;
      uVar12 = 0xffffffffffffffff;
      if (-1 < (int)uVar11) {
        uVar12 = uVar13 * 4;
      }
      pfVar10 = (float *)operator_new__(uVar12);
      (this->dx_).ptr_to_data = pfVar10;
      iVar6 = (pFVar8->dx_).num_elts;
      if ((iVar6 == 0) || ((pFVar9->dx_).num_elts == 0)) {
        if (0 < (int)uVar11) {
          iVar7 = (pFVar9->dx_).num_elts;
          pfVar14 = (pFVar8->dx_).ptr_to_data;
          fVar1 = pFVar9->val_;
          pfVar16 = (pFVar9->dx_).ptr_to_data;
          fVar2 = pFVar8->val_;
          uVar12 = 0;
          do {
            pfVar17 = pfVar14;
            if (iVar6 == 0) {
              pfVar17 = &pFVar8->defaultVal;
            }
            pfVar18 = pfVar16;
            if (iVar7 == 0) {
              pfVar18 = &pFVar9->defaultVal;
            }
            pfVar10[uVar12] = (*pfVar17 * fVar1 - *pfVar18 * fVar2) / (fVar1 * fVar1);
            uVar12 = uVar12 + 1;
            pfVar16 = pfVar16 + 1;
            pfVar14 = pfVar14 + 1;
          } while (uVar13 != uVar12);
        }
      }
      else if (0 < (int)uVar11) {
        pfVar14 = (pFVar8->dx_).ptr_to_data;
        pfVar16 = (pFVar9->dx_).ptr_to_data;
        fVar1 = pFVar9->val_;
        fVar2 = pFVar8->val_;
        uVar12 = 0;
        do {
          pfVar10[uVar12] = (pfVar14[uVar12] * fVar1 - pfVar16[uVar12] * fVar2) / (fVar1 * fVar1);
          uVar12 = uVar12 + 1;
        } while (uVar13 != uVar12);
      }
    }
    else {
      pfVar10 = (this->dx_).ptr_to_data;
      if (uVar3 == 0 || uVar4 == 0) {
        if (0 < (int)uVar5) {
          lVar15 = 0;
          do {
            pfVar14 = (float *)((long)(pFVar8->dx_).ptr_to_data + lVar15);
            if (uVar3 == 0) {
              pfVar14 = &pFVar8->defaultVal;
            }
            pfVar16 = (float *)((long)(pFVar9->dx_).ptr_to_data + lVar15);
            if (uVar4 == 0) {
              pfVar16 = &pFVar9->defaultVal;
            }
            fVar1 = pFVar9->val_;
            *(float *)((long)pfVar10 + lVar15) =
                 (*pfVar14 * fVar1 - pFVar8->val_ * *pfVar16) / (fVar1 * fVar1) +
                 *(float *)((long)pfVar10 + lVar15);
            lVar15 = lVar15 + 4;
          } while (uVar12 << 2 != lVar15);
        }
      }
      else if (0 < (int)uVar5) {
        pfVar14 = (pFVar8->dx_).ptr_to_data;
        pfVar16 = (pFVar9->dx_).ptr_to_data;
        uVar13 = 0;
        do {
          fVar1 = pFVar9->val_;
          pfVar10[uVar13] =
               (pfVar14[uVar13] * fVar1 - pFVar8->val_ * pfVar16[uVar13]) / (fVar1 * fVar1) +
               pfVar10[uVar13];
          uVar13 = uVar13 + 1;
        } while (uVar12 != uVar13);
      }
    }
  }
  this->val_ = pFVar8->val_ / pFVar9->val_ + this->val_;
  return this;
}

Assistant:

inline  Fad<T> & Fad<T>::operator+= (const FadExpr<ExprT>& x)
{
  int xsz = x.size(), sz = dx_.size();

  if (xsz) {
    if (sz) {
      T* RESTRICT dxp = dx_.begin();
      if (x.hasFastAccess())
	for (int i=0; i<sz; ++i)
	  dxp[i] += x.fastAccessDx(i);
      else
	for (int i=0; i<sz; ++i)
	  dxp[i] += x.dx(i);
    }
    else {
      dx_.resize(xsz);
      T* RESTRICT dxp = dx_.begin();
      if (x.hasFastAccess())
	for (int i=0; i<xsz; ++i)
	  dxp[i] = x.fastAccessDx(i);
      else
	for (int i=0; i<xsz; ++i)
	  dxp[i] = x.dx(i);
    }
  }

  val_ += x.val();

  return *this;
}